

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_error.cpp
# Opt level: O2

bool pfederc::logParserErrors(Logger *log,Parser *parser)

{
  Error<pfederc::SyntaxErrorCode> *pEVar1;
  Lexer *lexer;
  Level LVar2;
  bool bVar3;
  pointer puVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  LogMessage msg;
  allocator<char> local_109;
  string local_108;
  vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> local_e8;
  Position local_c8;
  string local_b0;
  LogMessage local_90;
  Logger *local_48;
  Parser *local_40;
  pointer local_38;
  
  puVar4 = (parser->errors).
           super__Vector_base<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (parser->errors).
             super__Vector_base<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = false;
  local_48 = log;
  local_40 = parser;
  do {
    if (puVar4 == local_38) {
      return bVar3;
    }
    pEVar1 = (puVar4->_M_t).
             super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
             .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>._M_head_impl;
    lexer = local_40->lexer;
    local_c8.line = (pEVar1->pos).line;
    local_c8.startIndex = (pEVar1->pos).startIndex;
    local_c8.endIndex = (pEVar1->pos).endIndex;
    LVar2 = pEVar1->logLevel;
    switch(pEVar1->err) {
    case STX_ERR_EXPECTED_PRIMARY_EXPR:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected primary expression",&local_109);
      logCreateErrorMessage(&local_b0,lexer,&local_c8,&local_108);
      goto LAB_00112f02;
    case STX_ERR_EXPECTED_CLOSING_BRACKET:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected \')\'",&local_109);
      break;
    case STX_ERR_EXPECTED_ARR_CLOSING_BRACKET:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected \']\'",&local_109);
      break;
    case STX_ERR_EXPECTED_TEMPL_CLOSING_BRACKET:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected \'}\'",&local_109);
      break;
    case STX_ERR_EXPECTED_FUNCTION_ID:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected identifier",&local_109);
      break;
    case STX_ERR_EXPECTED_PARAMETERS:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected function parameters",&local_109);
      break;
    case STX_ERR_INVALID_VARDECL_ID:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected variable identifier",&local_109);
      break;
    case STX_ERR_INVALID_VARDECL:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Invalid variable declaration",&local_109);
      break;
    case STX_ERR_EXPECTED_ID:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected identifier",&local_109);
      break;
    case STX_ERR_EXPECTED_VARDECL:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected variable declaration",&local_109);
      break;
    case STX_ERR_EXPECTED_GUARD:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected guard",&local_109);
      break;
    case STX_ERR_EXPECTED_FN_DCL_DEF:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected either function declaration or definition",
                 &local_109);
      break;
    case STX_ERR_EXPECTED_STMT:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected \';\'",&local_109);
      break;
    case STX_ERR_FUNC_VAR_NO_TEMPL:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Function type mustn\'t have a template.",&local_109);
      break;
    case STX_ERR_FUNC_VAR_NO_CAPS:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Function type mustn\'t have capabilities.",&local_109);
      break;
    case STX_ERR_EXPECTED_EOL:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected end-of-line",&local_109);
      break;
    case STX_ERR_EXPECTED_EOF:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected end-of-file",&local_109);
      break;
    case STX_ERR_EXPECTED_EOF_EOL:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected end-of-file or end-of-line",&local_109);
      break;
    case STX_ERR_INVALID_EXPR:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Invalid expression",&local_109);
      break;
    default:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Unknown error",&local_109);
      logCreateErrorMessage(&local_b0,lexer,&local_c8,&local_108);
LAB_00112f02:
      local_e8.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      LogMessage::LogMessage(&local_90,LVar2,&local_b0,&local_e8);
      std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_e8);
      std::__cxx11::string::~string((string *)&local_b0);
      goto LAB_00112e6e;
    case STX_ERR_PROGNAME:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected program name",&local_109);
      break;
    case STX_ERR_CLASS_SCOPE:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Invalid in class scope",&local_109);
      break;
    case STX_ERR_TRAIT_SCOPE:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Invalid in trait scope",&local_109);
      break;
    case STX_ERR_TRAIT_SCOPE_FUNC_TEMPL:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Invalid template function in trait scope",&local_109);
      break;
    case STX_ERR_TRAIT_SCOPE_FUNC_BODY:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"No function body in trait scope",&local_109);
      break;
    case STX_ERR_TRAITCLASS_SCOPE_FUNC_BODY:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected function body in class trait scope",&local_109);
      break;
    case STX_ERR_TRAITCLASS_IMPL:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected single reference to trait type",&local_109);
      break;
    case STX_ERR_ENUM_SCOPE:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Invalid in enum scope",&local_109);
      break;
    case STX_ERR_ENUM_BODY:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected enum body",&local_109);
      break;
    case STX_ERR_CLASS_TRAIT_SCOPE:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Invalid in class trait scope",&local_109);
      break;
    case STX_ERR_EXPECTED_CONSTRUCTION:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected constructor",&local_109);
      break;
    case STX_ERR_INVALID_TYPE_EXPR:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Invalid type expression",&local_109);
      break;
    case STX_ERR_EXPECTED_FOR:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected \'for\'",&local_109);
      break;
    case STX_ERR_EXPECTED_STMT_ELSE:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected \';\' or \'else\'",&local_109);
      break;
    case STX_ERR_EXPECTED_EOL_IF:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected either end-of-line or \'if\'",&local_109);
      break;
    case STX_ERR_EXPECTED_EOL_ENSURE:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected either end-of-line or \'ensure\'",&local_109);
      break;
    case STX_ERR_EXPECTED_ID_NUM_CHAR_BOOL:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,
                 "Expected either identifier, number, character or boolean token",&local_109);
      break;
    case STX_ERR_EXPECTED_ID_ANY:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected either identifier or \'_\'",&local_109);
      break;
    case STX_ERR_EXPECTED_OP_IMPL:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Expected \'=>\'",&local_109);
      break;
    case STX_ERR_INVALID_CAPS_ENSURE:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Invalid ensurance capability",&local_109);
      break;
    case STX_ERR_INVALID_CAPS_DIRECTIVE:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Invalid directive capability",&local_109);
      break;
    case STX_ERR_INVALID_CAPS_FOLLOWUP:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Invalid expression following capability list",&local_109);
    }
    logCreateErrorMessage(&local_b0,lexer,&local_c8,&local_108);
    local_e8.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.super__Vector_base<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LogMessage::LogMessage(&local_90,LVar2,&local_b0,&local_e8);
    std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::~vector(&local_e8);
    std::__cxx11::string::~string((string *)&local_b0);
LAB_00112e6e:
    std::__cxx11::string::~string((string *)&local_108);
    LVar2 = LogMessage::getLogLevel(&local_90);
    bVar3 = (bool)(bVar3 | LVar2 == LVL_ERROR);
    LogMessage::log(&local_90,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    LogMessage::~LogMessage(&local_90);
    puVar4 = puVar4 + 1;
  } while( true );
}

Assistant:

bool pfederc::logParserErrors(Logger &log, const Parser &parser) noexcept {
  bool result = false;
  for (const auto &stxErr : parser.getErrors()) {
    LogMessage msg = _logParserError(parser, *stxErr);
    if (msg.getLogLevel() == LVL_ERROR)
      result = true;
    msg.log(log);
  }

  return result;
}